

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::ThreadPool::ThreadPool(ThreadPool *this,size_t n)

{
  long in_RSI;
  ThreadPool *in_RDI;
  vector<std::thread,_std::allocator<std::thread>_> *__args;
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *this_00;
  worker local_18;
  long local_10;
  
  local_10 = in_RSI;
  TaskQueue::TaskQueue(&in_RDI->super_TaskQueue);
  (in_RDI->super_TaskQueue)._vptr_TaskQueue = (_func_int **)&PTR__ThreadPool_002f4348;
  __args = &in_RDI->threads_;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x172b3e);
  this_00 = &in_RDI->jobs_;
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::list
            ((list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)0x172b51);
  in_RDI->shutdown_ = false;
  std::condition_variable::condition_variable(&in_RDI->cond_);
  std::mutex::mutex((mutex *)0x172b76);
  for (; local_10 != 0; local_10 = local_10 + -1) {
    worker::worker(&local_18,in_RDI);
    std::vector<std::thread,_std::allocator<std::thread>_>::
    emplace_back<httplib::ThreadPool::worker>
              ((vector<std::thread,_std::allocator<std::thread>_> *)this_00,(worker *)__args);
  }
  return;
}

Assistant:

explicit ThreadPool(size_t n) : shutdown_(false) {
    while (n) {
      threads_.emplace_back(worker(*this));
      n--;
    }
  }